

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionEndInfo::SectionEndInfo
          (SectionEndInfo *this,SectionInfo *_sectionInfo,Counts *_prevAssertions,
          double _durationInSeconds)

{
  double _durationInSeconds_local;
  Counts *_prevAssertions_local;
  SectionInfo *_sectionInfo_local;
  SectionEndInfo *this_local;
  
  SectionInfo::SectionInfo(&this->sectionInfo,_sectionInfo);
  (this->prevAssertions).passed = _prevAssertions->passed;
  (this->prevAssertions).failed = _prevAssertions->failed;
  (this->prevAssertions).failedButOk = _prevAssertions->failedButOk;
  this->durationInSeconds = _durationInSeconds;
  return;
}

Assistant:

SectionEndInfo( SectionInfo const& _sectionInfo, Counts const& _prevAssertions, double _durationInSeconds )
        : sectionInfo( _sectionInfo ), prevAssertions( _prevAssertions ), durationInSeconds( _durationInSeconds )
        {}